

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall
CVmObjTads::inh_prop
          (CVmObjTads *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  undefined4 in_ECX;
  uint *in_RDX;
  undefined2 in_SI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  vm_obj_id_t in_R9D;
  vm_prop_id_t unaff_retaddr;
  CVmObject *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_R9D == 0) ||
     ((iVar1 = CVmObjIntClsMod::is_intcls_mod_obj(0), iVar1 == 0 &&
      (iVar1 = CVmObjClass::is_intcls_obj(0), iVar1 == 0)))) {
    iVar1 = search_for_prop_from
                      ((uint)in_RDI,
                       (vm_val_t *)
                       CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
                       ,(vm_obj_id_t)((ulong)in_RDX >> 0x20),(vm_obj_id_t *)CONCAT44(in_ECX,in_R8D),
                       in_R9D);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = get_prop_intrinsic((CVmObjTads *)in_stack_00000008,unaff_retaddr,
                               (vm_val_t *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (vm_obj_id_t)((ulong)in_RDI >> 0x20),
                               (vm_obj_id_t *)
                               CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,
                                                       in_stack_ffffffffffffffe8)),in_RDX);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = CVmObject::inh_prop(in_stack_00000008,unaff_retaddr,
                              (vm_val_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (vm_obj_id_t)((ulong)in_RDI >> 0x20),(vm_obj_id_t)in_RDI,
                              CONCAT22(in_SI,in_stack_ffffffffffffffec),
                              (vm_obj_id_t *)CONCAT44(self,orig_target_obj),&val->typ);
  return iVar1;
}

Assistant:

int CVmObjTads::inh_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                         vm_obj_id_t self,
                         vm_obj_id_t orig_target_obj,
                         vm_obj_id_t defining_obj,
                         vm_obj_id_t *source_obj, uint *argc)
{
    /* 
     *   check to see if we're already inheriting from an intrinsic class or
     *   an intrinsic class modifier 
     */
    if (defining_obj == VM_INVALID_OBJ
        || (!CVmObjIntClsMod::is_intcls_mod_obj(vmg_ defining_obj)
            && !CVmObjClass::is_intcls_obj(vmg_ defining_obj)))
    {
        /* 
         *   The previous defining object wasn't itself an intrinsic class or
         *   modifier object, so continue searching for TadsObject
         *   superclasses.  
         */
        if (search_for_prop_from(vmg_ prop, val,
                                 orig_target_obj, source_obj, defining_obj))
            return TRUE;

        /* 
         *   We didn't find the property in a property list.  Since we were
         *   inheriting, we must have originally found it in a property list,
         *   but we've found no more inherited properties.  Next, check the
         *   intrinsic methods of the intrinsic class.  
         */
        if (get_prop_intrinsic(vmg_ prop, val, self, source_obj, argc))
            return TRUE;

        /*
         *   We didn't find it among our TadsObject superclasses or as an
         *   intrinsic method.  There's still one possibility: it could be
         *   defined in an intrinsic class modifier for TadsObject or one of
         *   its intrinsic superclasses (aka supermetaclasses).
         *   
         *   This represents a new starting point in the search.  No longer
         *   are we looking for TadsObject overrides; we're now looking for
         *   modifier objects.  The modifier objects effectively form a
         *   separate class hierarchy alongside the intrinsic class hierarchy
         *   they modify.  Since we're starting a new search in this new
         *   context, forget the previous defining object - it has a
         *   different meaning in the new context, and we want to start the
         *   new search from the beginning.
         *   
         *   Note that if this search does turn up a modifier object, and
         *   that modifier object further inherits, we'll come back through
         *   this method again to find the base class method.  At that point,
         *   however we'll notice that the previous defining object was a
         *   modifier, so we will not go through this branch again - we'll go
         *   directly to the base metaclass and continue the inheritance
         *   search there.  
         */
        defining_obj = VM_INVALID_OBJ;
    }

    /* continue searching via our base metaclass */
    return CVmObject::inh_prop(vmg_ prop, val, self, orig_target_obj,
                               defining_obj, source_obj, argc);
}